

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

int value_in_set_display_error(unsigned_long value,CheckIntegerSet *check_integer_set,int invert)

{
  unsigned_long *puVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  
  if (check_integer_set == (CheckIntegerSet *)0x0) {
    cm_print_error("%s\n","check_integer_set");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x4c5);
  }
  puVar1 = check_integer_set->set;
  sVar2 = check_integer_set->size_of_set;
  uVar5 = invert;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      if (puVar1[sVar3] == value) {
        uVar5 = (uint)(invert == 0);
        break;
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  if (uVar5 == 0) {
    pcVar4 = "";
    if (invert == 0) {
      pcVar4 = "not ";
    }
    cm_print_error("%lu is %sin the set (",value,pcVar4);
    if (sVar2 != 0) {
      sVar3 = 0;
      do {
        cm_print_error("%#lx, ",puVar1[sVar3]);
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    cm_print_error(")\n");
  }
  return (int)(uVar5 != 0);
}

Assistant:

static int value_in_set_display_error(
        const LargestIntegralType value,
        const CheckIntegerSet * const check_integer_set, const int invert) {
    int succeeded = invert;
    assert_non_null(check_integer_set);
    {
        const LargestIntegralType * const set = check_integer_set->set;
        const size_t size_of_set = check_integer_set->size_of_set;
        size_t i;
        for (i = 0; i < size_of_set; i++) {
            if (set[i] == value) {
                /* If invert = 0 and item is found, succeeded = 1. */
                /* If invert = 1 and item is found, succeeded = 0. */
                succeeded = !succeeded;
                break;
            }
        }
        if (succeeded) {
            return 1;
        }
        cm_print_error(LargestIntegralTypePrintfFormatDecimal
                       " is %sin the set (",
                       value, invert ? "" : "not ");
        for (i = 0; i < size_of_set; i++) {
            cm_print_error(LargestIntegralTypePrintfFormat ", ", set[i]);
        }
        cm_print_error(")\n");
    }
    return 0;
}